

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ClipControlRenderBaseTest::fuzzyDepthCompare
          (ClipControlRenderBaseTest *this,TestLog *log,char *imageSetName,char *imageSetDesc,
          TextureLevel *reference,TextureLevel *result,float threshold,TextureLevel *importanceMask)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  MessageBuilder *pMVar4;
  TestLog *pTVar5;
  ConstPixelBufferAccess *this_00;
  int extraout_XMM0_Da;
  float fVar6;
  byte local_631;
  byte local_629;
  ConstPixelBufferAccess local_628;
  allocator<char> local_5f9;
  string local_5f8;
  allocator<char> local_5d1;
  string local_5d0;
  LogImage local_5b0;
  ConstPixelBufferAccess local_520;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  LogImage local_4a8;
  ConstPixelBufferAccess local_418;
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  LogImage local_3a0;
  allocator<char> local_309;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0;
  LogImageSet local_2c0;
  undefined1 local_27c [8];
  Vec4 pixelScale;
  Vec4 pixelBias;
  MessageBuilder local_250;
  ConstPixelBufferAccess local_d0;
  ConstPixelBufferAccess local_a8;
  float local_7c;
  float res;
  float local_50;
  int local_4c;
  float ref;
  int x;
  int y;
  float difference;
  bool depthOk;
  TextureLevel *pTStack_38;
  float threshold_local;
  TextureLevel *result_local;
  TextureLevel *reference_local;
  char *imageSetDesc_local;
  char *imageSetName_local;
  TestLog *log_local;
  ClipControlRenderBaseTest *this_local;
  
  y._3_1_ = 1;
  x = 0;
  ref = 0.0;
  difference = threshold;
  pTStack_38 = result;
  result_local = reference;
  reference_local = (TextureLevel *)imageSetDesc;
  imageSetDesc_local = imageSetName;
  imageSetName_local = (char *)log;
  log_local = (TestLog *)this;
  while( true ) {
    fVar6 = ref;
    iVar2 = tcu::TextureLevel::getHeight(pTStack_38);
    local_629 = 0;
    if ((int)fVar6 < iVar2) {
      local_629 = y._3_1_;
    }
    if ((local_629 & 1) == 0) break;
    local_4c = 0;
    while( true ) {
      iVar2 = local_4c;
      iVar3 = tcu::TextureLevel::getWidth(pTStack_38);
      local_631 = 0;
      if (iVar2 < iVar3) {
        local_631 = y._3_1_;
      }
      if ((local_631 & 1) == 0) break;
      tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)&stack0xffffffffffffff88,result_local);
      local_50 = tcu::ConstPixelBufferAccess::getPixDepth
                           ((ConstPixelBufferAccess *)&stack0xffffffffffffff88,local_4c,(int)ref,0);
      tcu::TextureLevel::getAccess(&local_a8,pTStack_38);
      this_00 = &local_a8;
      local_7c = tcu::ConstPixelBufferAccess::getPixDepth(this_00,local_4c,(int)ref,0);
      std::abs((int)this_00);
      x = extraout_XMM0_Da;
      if (importanceMask != (TextureLevel *)0x0) {
        tcu::TextureLevel::getAccess(&local_d0,importanceMask);
        fVar6 = tcu::ConstPixelBufferAccess::getPixDepth(&local_d0,local_4c,(int)ref,0);
        x = (int)(fVar6 * (float)x);
      }
      y._3_1_ = (y._3_1_ & 1 & (float)x < difference) != 0;
      local_4c = local_4c + 1;
    }
    ref = (float)((int)ref + 1);
  }
  if ((y._3_1_ & 1) == 0) {
    tcu::TestLog::operator<<
              (&local_250,(TestLog *)imageSetName_local,(BeginMessageToken *)&tcu::TestLog::Message)
    ;
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_250,(char (*) [39])"Image comparison failed: difference = ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(float *)&x);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [15])0x2c82344);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&difference);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_250);
  }
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(pixelScale.m_data + 2),0.0,0.0,0.0,0.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_27c,1.0,1.0,1.0,1.0);
  pcVar1 = imageSetName_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"Result",&local_2e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,"Depth image comparison result",&local_309);
  tcu::LogImageSet::LogImageSet(&local_2c0,&local_2e0,&local_308);
  pTVar5 = tcu::TestLog::operator<<((TestLog *)pcVar1,&local_2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"Result",&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"Result",&local_3e9);
  tcu::TextureLevel::getAccess(&local_418,pTStack_38);
  tcu::LogImage::LogImage
            (&local_3a0,&local_3c0,&local_3e8,&local_418,(Vec4 *)local_27c,
             (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_3a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"Reference",&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"Reference",&local_4f1);
  tcu::TextureLevel::getAccess(&local_520,result_local);
  tcu::LogImage::LogImage
            (&local_4a8,&local_4c8,&local_4f0,&local_520,(Vec4 *)local_27c,
             (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(pTVar5,&local_4a8);
  tcu::LogImage::~LogImage(&local_4a8);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  tcu::LogImage::~LogImage(&local_3a0);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  tcu::LogImageSet::~LogImageSet(&local_2c0);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator(&local_309);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  pcVar1 = imageSetName_local;
  if (importanceMask != (TextureLevel *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5d0,"Importance mask",&local_5d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f8,"mask",&local_5f9);
    tcu::TextureLevel::getAccess(&local_628,importanceMask);
    tcu::LogImage::LogImage
              (&local_5b0,&local_5d0,&local_5f8,&local_628,(Vec4 *)local_27c,
               (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<((TestLog *)pcVar1,&local_5b0);
    tcu::LogImage::~LogImage(&local_5b0);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::allocator<char>::~allocator(&local_5f9);
    std::__cxx11::string::~string((string *)&local_5d0);
    std::allocator<char>::~allocator(&local_5d1);
  }
  tcu::TestLog::operator<<
            ((TestLog *)imageSetName_local,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
  return (bool)(y._3_1_ & 1);
}

Assistant:

bool fuzzyDepthCompare(tcu::TestLog& log, const char* imageSetName, const char* imageSetDesc,
						   const tcu::TextureLevel& reference, const tcu::TextureLevel& result, float threshold,
						   const tcu::TextureLevel* importanceMask = NULL)
	{
		(void)imageSetName;
		(void)imageSetDesc;
		bool  depthOk	= true;
		float difference = 0.0f;

		for (int y = 0; y < result.getHeight() && depthOk; y++)
		{
			for (int x = 0; x < result.getWidth() && depthOk; x++)
			{
				float ref  = reference.getAccess().getPixDepth(x, y);
				float res  = result.getAccess().getPixDepth(x, y);
				difference = std::abs(ref - res);
				if (importanceMask)
				{
					difference *= importanceMask->getAccess().getPixDepth(x, y);
				}
				depthOk &= (difference < threshold);
			}
		}

		if (!depthOk)
			log << tcu::TestLog::Message << "Image comparison failed: difference = " << difference
				<< ", threshold = " << threshold << tcu::TestLog::EndMessage;
		tcu::Vec4 pixelBias(0.0f, 0.0f, 0.0f, 0.0f);
		tcu::Vec4 pixelScale(1.0f, 1.0f, 1.0f, 1.0f);
		log << tcu::TestLog::ImageSet("Result", "Depth image comparison result")
			<< tcu::TestLog::Image("Result", "Result", result.getAccess(), pixelScale, pixelBias)
			<< tcu::TestLog::Image("Reference", "Reference", reference.getAccess(), pixelScale, pixelBias);
		if (importanceMask)
		{
			log << tcu::TestLog::Image("Importance mask", "mask", importanceMask->getAccess(), pixelScale, pixelBias);
		}
		log << tcu::TestLog::EndImageSet;

		return depthOk;
	}